

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_history.c
# Opt level: O0

void fsg_history_utt_start(fsg_history_t *h)

{
  int32 np;
  int32 ns;
  int32 lc;
  int32 s;
  fsg_history_t *h_local;
  
  if (h->entries->n_valid != 0) {
    __assert_fail("blkarray_list_n_valid(h->entries) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_history.c"
                  ,0x10a,"void fsg_history_utt_start(fsg_history_t *)");
  }
  if (h->frame_entries != (glist_t **)0x0) {
    ns = 0;
    do {
      if (h->fsg->n_state <= ns) {
        return;
      }
      for (np = 0; np < h->n_ciphone; np = np + 1) {
        if (h->frame_entries[ns][np] != (glist_t)0x0) {
          __assert_fail("h->frame_entries[s][lc] == NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_history.c"
                        ,0x112,"void fsg_history_utt_start(fsg_history_t *)");
        }
      }
      ns = ns + 1;
    } while( true );
  }
  __assert_fail("h->frame_entries",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_history.c"
                ,0x10b,"void fsg_history_utt_start(fsg_history_t *)");
}

Assistant:

void
fsg_history_utt_start(fsg_history_t * h)
{
    int32 s, lc, ns, np;

    assert(blkarray_list_n_valid(h->entries) == 0);
    assert(h->frame_entries);

    ns = fsg_model_n_state(h->fsg);
    np = h->n_ciphone;

    for (s = 0; s < ns; s++) {
        for (lc = 0; lc < np; lc++) {
            assert(h->frame_entries[s][lc] == NULL);
        }
    }
}